

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_decompress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uchar *in_RCX;
  ucvector *in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  uint error;
  ucvector v;
  uchar *local_40;
  size_t local_38;
  LodePNGDecompressSettings *in_stack_ffffffffffffffd0;
  
  ucvector_init((ucvector *)&local_40,(uchar *)*in_RDI,*in_RSI);
  uVar1 = lodepng_zlib_decompressv(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  *in_RDI = local_40;
  *in_RSI = local_38;
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_decompress(unsigned char** out, size_t* outsize, const unsigned char* in,
  size_t insize, const LodePNGDecompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_zlib_decompressv(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}